

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_class_declare(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  code *action;
  char *name;
  int yypos273;
  int yythunkpos273;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,3,0,"yyPush");
  yyDo(G,yy_1_class_declare,G->begin,G->end,"yy_1_class_declare");
  iVar5 = yymatchString(G,"class");
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar9 = G->thunkpos;
    iVar6 = yy_ws(G);
    if (iVar6 == 0) {
LAB_0010e75b:
      G->pos = iVar5;
      G->thunkpos = iVar9;
    }
    else {
      do {
        iVar6 = G->pos;
        iVar3 = G->thunkpos;
        iVar7 = yy_ws(G);
      } while (iVar7 != 0);
      G->pos = iVar6;
      G->thunkpos = iVar3;
      iVar6 = yy_ident(G);
      if (iVar6 == 0) goto LAB_0010e75b;
      yyDo(G,yySet,-3,0,"yySet");
    }
    yy__(G);
    iVar5 = G->pos;
    iVar9 = G->thunkpos;
    yyDo(G,yyPush,2,0,"yyPush");
    iVar6 = G->pos;
    iVar3 = G->thunkpos;
    iVar7 = yymatchString(G,"is");
    if ((iVar7 != 0) && (iVar7 = yy_ws(G), iVar7 != 0)) {
      do {
        iVar7 = G->pos;
        iVar4 = G->thunkpos;
        iVar8 = yy_ws(G);
      } while (iVar8 != 0);
      G->pos = iVar7;
      G->thunkpos = iVar4;
      iVar7 = yy_ident(G);
      if (iVar7 != 0) {
        yyDo(G,yySet,-2,0,"yySet");
        yyDo(G,yy_1_is_does_list,G->begin,G->end,"yy_1_is_does_list");
        do {
          while( true ) {
            iVar5 = G->pos;
            iVar9 = G->thunkpos;
            yy__(G);
            iVar6 = yymatchString(G,"is");
            if ((iVar6 == 0) || (iVar6 = yy_ws(G), iVar6 == 0)) break;
            do {
              iVar6 = G->pos;
              iVar3 = G->thunkpos;
              iVar7 = yy_ws(G);
            } while (iVar7 != 0);
            G->pos = iVar6;
            G->thunkpos = iVar3;
            iVar6 = yy_ident(G);
            if (iVar6 == 0) break;
            yyDo(G,yySet,-1,0,"yySet");
            yyDo(G,yy_2_is_does_list,G->begin,G->end,"yy_2_is_does_list");
          }
          G->pos = iVar5;
          G->thunkpos = iVar9;
          yy__(G);
          iVar6 = yymatchString(G,"does");
          if ((iVar6 == 0) || (iVar6 = yy_ws(G), iVar6 == 0)) goto LAB_0010eb35;
          do {
            iVar6 = G->pos;
            iVar3 = G->thunkpos;
            iVar7 = yy_ws(G);
          } while (iVar7 != 0);
          G->pos = iVar6;
          G->thunkpos = iVar3;
          iVar6 = yy_ident(G);
          if (iVar6 == 0) goto LAB_0010eb35;
          yyDo(G,yySet,-1,0,"yySet");
          yyDo(G,yy_3_is_does_list,G->begin,G->end,"yy_3_is_does_list");
        } while( true );
      }
    }
    G->pos = iVar6;
    G->thunkpos = iVar3;
    iVar6 = yymatchString(G,"does");
    if ((iVar6 != 0) && (iVar6 = yy_ws(G), iVar6 != 0)) {
      do {
        iVar6 = G->pos;
        iVar3 = G->thunkpos;
        iVar7 = yy_ws(G);
      } while (iVar7 != 0);
      G->pos = iVar6;
      G->thunkpos = iVar3;
      iVar6 = yy_ident(G);
      if (iVar6 != 0) {
        yyDo(G,yySet,-2,0,"yySet");
        yyDo(G,yy_5_is_does_list,G->begin,G->end,"yy_5_is_does_list");
        do {
          while( true ) {
            iVar5 = G->pos;
            iVar9 = G->thunkpos;
            yy__(G);
            iVar6 = yymatchString(G,"is");
            if ((iVar6 == 0) || (iVar6 = yy_ws(G), iVar6 == 0)) break;
            do {
              iVar6 = G->pos;
              iVar3 = G->thunkpos;
              iVar7 = yy_ws(G);
            } while (iVar7 != 0);
            G->pos = iVar6;
            G->thunkpos = iVar3;
            iVar6 = yy_ident(G);
            if (iVar6 == 0) break;
            yyDo(G,yySet,-1,0,"yySet");
            yyDo(G,yy_6_is_does_list,G->begin,G->end,"yy_6_is_does_list");
          }
          G->pos = iVar5;
          G->thunkpos = iVar9;
          yy__(G);
          iVar6 = yymatchString(G,"does");
          if ((iVar6 == 0) || (iVar6 = yy_ws(G), iVar6 == 0)) goto LAB_0010eb53;
          do {
            iVar6 = G->pos;
            iVar3 = G->thunkpos;
            iVar7 = yy_ws(G);
          } while (iVar7 != 0);
          G->pos = iVar6;
          G->thunkpos = iVar3;
          iVar6 = yy_ident(G);
          if (iVar6 == 0) goto LAB_0010eb53;
          yyDo(G,yySet,-1,0,"yySet");
          yyDo(G,yy_7_is_does_list,G->begin,G->end,"yy_7_is_does_list");
        } while( true );
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar9;
    goto LAB_0010ebb0;
  }
  goto LAB_0010ec25;
LAB_0010eb35:
  G->pos = iVar5;
  G->thunkpos = iVar9;
  iVar5 = G->begin;
  iVar9 = G->end;
  action = yy_4_is_does_list;
  name = "yy_4_is_does_list";
  goto LAB_0010eb6f;
LAB_0010eb53:
  G->pos = iVar5;
  G->thunkpos = iVar9;
  iVar5 = G->begin;
  iVar9 = G->end;
  action = yy_8_is_does_list;
  name = "yy_8_is_does_list";
LAB_0010eb6f:
  yyDo(G,action,iVar5,iVar9,name);
  yyDo(G,yyPop,2,0,"yyPop");
  yyDo(G,yySet,-2,0,"yySet");
LAB_0010ebb0:
  yy__(G);
  iVar5 = yy_block(G);
  if (iVar5 == 0) {
LAB_0010ec25:
    iVar5 = 0;
    G->pos = iVar1;
    G->thunkpos = iVar2;
  }
  else {
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_2_class_declare,G->begin,G->end,"yy_2_class_declare");
    yyDo(G,yyPop,3,0,"yyPop");
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

YY_RULE(int) yy_class_declare(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 3, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "class_declare"));
  yyDo(G, yy_1_class_declare, G->begin, G->end, "yy_1_class_declare");
  if (!yymatchString(G, "class")) goto l289;

  {  int yypos290= G->pos, yythunkpos290= G->thunkpos;  if (!yy_ws(G))  goto l290;

  l292:;	
  {  int yypos293= G->pos, yythunkpos293= G->thunkpos;  if (!yy_ws(G))  goto l293;
  goto l292;
  l293:;	  G->pos= yypos293; G->thunkpos= yythunkpos293;
  }  if (!yy_ident(G))  goto l290;
  yyDo(G, yySet, -3, 0, "yySet");
  goto l291;
  l290:;	  G->pos= yypos290; G->thunkpos= yythunkpos290;
  }
  l291:;	  if (!yy__(G))  goto l289;

  {  int yypos294= G->pos, yythunkpos294= G->thunkpos;  if (!yy_is_does_list(G))  goto l294;
  yyDo(G, yySet, -2, 0, "yySet");
  goto l295;
  l294:;	  G->pos= yypos294; G->thunkpos= yythunkpos294;
  }
  l295:;	  if (!yy__(G))  goto l289;
  if (!yy_block(G))  goto l289;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_class_declare, G->begin, G->end, "yy_2_class_declare");
  yyprintf((stderr, "  ok   class_declare"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 3, 0, "yyPop");
  return 1;
  l289:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "class_declare"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}